

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O3

void anon_unknown.dwarf_335036::check<long>(istream *is,long c)

{
  ulong in_RAX;
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  char b [8];
  ulong local_28;
  
  local_28 = in_RAX;
  std::istream::read((char *)is,(long)&local_28);
  __s = __DeepScanLineInputFile + (*__DeepScanLineInputFile == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", got ",6);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((local_28 & 0xff00000000000000 |
      (local_28 >> 0x30 & 0xff) << 0x30 |
      (local_28 >> 0x28 & 0xff) << 0x28 |
      (local_28 >> 0x20 & 0xff) << 0x20 |
      (local_28 >> 0x18 & 0xff) << 0x18 |
      (local_28 >> 0x10 & 0xff) << 0x10 | (local_28 >> 8 & 0xff) << 8 | local_28 & 0xff) == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = long]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}